

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O1

int epoll_apply_one_change(event_base *base,epollop *epollop,event_change *ch)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  uint *puVar9;
  uint uVar10;
  char *pcVar11;
  epoll_event epev;
  
  bVar1 = *(byte *)((long)&epollop->events + 6);
  bVar2 = *(byte *)((long)&epollop->events + 7);
  uVar10 = (uint)*(short *)((long)&epollop->events + 4);
  uVar10 = ((uVar10 & 6) << 5 | (bVar2 & 3) << 4 | ((byte)epollop->nevents & 3) + (bVar1 & 3) * 4) +
           (uVar10 & 0x80) * 2;
  iVar7 = epoll_op_table[uVar10].op;
  if (epoll_op_table[uVar10].events == 0) {
    if (iVar7 == 0) {
      return 0;
    }
    epoll_apply_one_change_cold_1();
  }
  epev.data.u64._4_4_ = 0;
  epev.data.fd = *(int *)&epollop->events;
  epev.events = ((bVar2 | bVar1) & 0xffffffe0) << 0x1a | epoll_op_table[uVar10].events;
  iVar6 = epoll_ctl(*(int *)((long)&base->evbase + 4),iVar7,*(int *)&epollop->events,
                    (epoll_event *)&epev);
  if (iVar6 == 0) {
    if (event_debug_logging_mask_ == 0) {
      return 0;
    }
    if (iVar7 == 1) {
      pcVar11 = "ADD";
    }
    else if (iVar7 == 2) {
      pcVar11 = "DEL";
    }
    else {
      pcVar11 = "???";
      if (iVar7 == 3) {
        pcVar11 = "MOD";
      }
    }
    bVar1 = *(byte *)((long)&epollop->events + 6);
    bVar2 = *(byte *)((long)&epollop->events + 7);
    bVar3 = (byte)epollop->nevents;
    event_debugx_("Epoll %s(%d) on fd %d okay. Old events were %d; read change was %d (%s); write change was %d (%s); close change was %d (%s)"
                  ,pcVar11,epev._0_8_ & 0xffffffff,(ulong)*(uint *)&epollop->events,
                  (ulong)(uint)(int)*(short *)((long)&epollop->events + 4),(ulong)bVar1,
                  *(undefined8 *)(&DAT_0027ca90 + (ulong)(bVar1 & 3) * 8),(ulong)bVar2,
                  *(undefined8 *)(&DAT_0027ca90 + (ulong)(bVar2 & 3) * 8),(ulong)bVar3,
                  *(undefined8 *)(&DAT_0027ca90 + (ulong)(bVar3 & 3) * 8));
    return 0;
  }
  if (iVar7 == 1) {
    piVar8 = __errno_location();
    if (*piVar8 == 0x11) {
      iVar7 = epoll_ctl(*(int *)((long)&base->evbase + 4),3,*(int *)&epollop->events,
                        (epoll_event *)&epev);
      if (iVar7 != -1) {
        if (event_debug_logging_mask_ == 0) {
          return 0;
        }
        uVar10 = *(uint *)&epollop->events;
        pcVar11 = "Epoll ADD(%d) on %d retried as MOD; succeeded.";
LAB_001f6fc0:
        event_debugx_(pcVar11,(ulong)epev.events,(ulong)uVar10);
        return 0;
      }
      uVar10 = *(uint *)&epollop->events;
      pcVar11 = "Epoll ADD(%d) on %d retried as MOD; that failed too";
LAB_001f7113:
      event_warn(pcVar11,(ulong)epev.events,(ulong)uVar10);
      return -1;
    }
LAB_001f6fce:
    if (iVar7 == 1) {
      pcVar11 = "ADD";
      goto LAB_001f7087;
    }
    if (iVar7 == 2) {
      pcVar11 = "DEL";
      goto LAB_001f7087;
    }
  }
  else {
    if (iVar7 == 2) {
      puVar9 = (uint *)__errno_location();
      uVar5 = epev._0_8_;
      uVar10 = *puVar9;
      if ((uVar10 < 10) && ((0x206U >> (uVar10 & 0x1f) & 1) != 0)) {
        if (event_debug_logging_mask_ == 0) {
          return 0;
        }
        uVar4 = *(uint *)&epollop->events;
        pcVar11 = strerror(uVar10);
        event_debugx_("Epoll DEL(%d) on fd %d gave %s: DEL was unnecessary.",uVar5 & 0xffffffff,
                      (ulong)uVar4,pcVar11);
        return 0;
      }
      goto LAB_001f6fce;
    }
    if (iVar7 == 3) {
      piVar8 = __errno_location();
      if (*piVar8 == 2) {
        iVar7 = epoll_ctl(*(int *)((long)&base->evbase + 4),1,*(int *)&epollop->events,
                          (epoll_event *)&epev);
        if (iVar7 != -1) {
          if (event_debug_logging_mask_ == 0) {
            return 0;
          }
          uVar10 = *(uint *)&epollop->events;
          pcVar11 = "Epoll MOD(%d) on %d retried as ADD; succeeded.";
          goto LAB_001f6fc0;
        }
        uVar10 = *(uint *)&epollop->events;
        pcVar11 = "Epoll MOD(%d) on %d retried as ADD; that failed too";
        goto LAB_001f7113;
      }
      goto LAB_001f6fce;
    }
  }
  pcVar11 = "???";
  if (iVar7 == 3) {
    pcVar11 = "MOD";
  }
LAB_001f7087:
  bVar1 = *(byte *)((long)&epollop->events + 6);
  bVar2 = *(byte *)((long)&epollop->events + 7);
  bVar3 = (byte)epollop->nevents;
  event_warn("Epoll %s(%d) on fd %d failed. Old events were %d; read change was %d (%s); write change was %d (%s); close change was %d (%s)"
             ,pcVar11,epev._0_8_ & 0xffffffff,(ulong)*(uint *)&epollop->events,
             (ulong)(uint)(int)*(short *)((long)&epollop->events + 4),(ulong)bVar1,
             *(undefined8 *)(&DAT_0027ca90 + (ulong)(bVar1 & 3) * 8),(ulong)bVar2,
             *(undefined8 *)(&DAT_0027ca90 + (ulong)(bVar2 & 3) * 8),(ulong)bVar3,
             *(undefined8 *)(&DAT_0027ca90 + (ulong)(bVar3 & 3) * 8));
  return -1;
}

Assistant:

static int
epoll_apply_one_change(struct event_base *base,
    struct epollop *epollop,
    const struct event_change *ch)
{
	struct epoll_event epev;
	int op, events = 0;
	int idx;

	idx = EPOLL_OP_TABLE_INDEX(ch);
	op = epoll_op_table[idx].op;
	events = epoll_op_table[idx].events;

	if (!events) {
		EVUTIL_ASSERT(op == 0);
		return 0;
	}

	if ((ch->read_change|ch->write_change) & EV_CHANGE_ET)
		events |= EPOLLET;

	memset(&epev, 0, sizeof(epev));
	epev.data.fd = ch->fd;
	epev.events = events;
	if (epoll_ctl(epollop->epfd, op, ch->fd, &epev) == 0) {
		event_debug((PRINT_CHANGES(op, epev.events, ch, "okay")));
		return 0;
	}

	switch (op) {
	case EPOLL_CTL_MOD:
		if (errno == ENOENT) {
			/* If a MOD operation fails with ENOENT, the
			 * fd was probably closed and re-opened.  We
			 * should retry the operation as an ADD.
			 */
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_ADD, ch->fd, &epev) == -1) {
				event_warn("Epoll MOD(%d) on %d retried as ADD; that failed too",
				    (int)epev.events, ch->fd);
				return -1;
			} else {
				event_debug(("Epoll MOD(%d) on %d retried as ADD; succeeded.",
					(int)epev.events,
					ch->fd));
				return 0;
			}
		}
		break;
	case EPOLL_CTL_ADD:
		if (errno == EEXIST) {
			/* If an ADD operation fails with EEXIST,
			 * either the operation was redundant (as with a
			 * precautionary add), or we ran into a fun
			 * kernel bug where using dup*() to duplicate the
			 * same file into the same fd gives you the same epitem
			 * rather than a fresh one.  For the second case,
			 * we must retry with MOD. */
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_MOD, ch->fd, &epev) == -1) {
				event_warn("Epoll ADD(%d) on %d retried as MOD; that failed too",
				    (int)epev.events, ch->fd);
				return -1;
			} else {
				event_debug(("Epoll ADD(%d) on %d retried as MOD; succeeded.",
					(int)epev.events,
					ch->fd));
				return 0;
			}
		}
		break;
	case EPOLL_CTL_DEL:
		if (errno == ENOENT || errno == EBADF || errno == EPERM) {
			/* If a delete fails with one of these errors,
			 * that's fine too: we closed the fd before we
			 * got around to calling epoll_dispatch. */
			event_debug(("Epoll DEL(%d) on fd %d gave %s: DEL was unnecessary.",
				(int)epev.events,
				ch->fd,
				strerror(errno)));
			return 0;
		}
		break;
	default:
		break;
	}

	event_warn(PRINT_CHANGES(op, epev.events, ch, "failed"));
	return -1;
}